

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

bool cfd::TransactionContextUtil::IsOpTrueLockingScript(UtxoData *utxo,AbstractTxIn *txin)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference this;
  ScriptOperator *this_00;
  undefined8 uVar4;
  AbstractTxIn *in_RSI;
  long in_RDI;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> locking_script_items;
  Script *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff18;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff20;
  CfdException *this_01;
  allocator local_c1;
  string local_c0 [32];
  Script local_a0;
  undefined1 local_62;
  undefined1 local_61 [49];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_30;
  AbstractTxIn *local_18;
  byte local_1;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_18 = in_RSI;
  core::Script::GetElementList(&local_30,(Script *)(in_RDI + 0x50));
  sVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                    (&local_30);
  if (sVar3 == 1) {
    this = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
           operator[](&local_30,0);
    this_00 = core::ScriptElement::GetOpCode(this);
    bVar1 = core::ScriptOperator::operator==
                      (this_00,(ScriptOperator *)core::ScriptOperator::OP_TRUE);
    if (bVar1) {
      uVar2 = core::AbstractTxIn::GetScriptWitnessStackNum(local_18);
      if (uVar2 != 0) {
        local_62 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        this_01 = (CfdException *)local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_61 + 1),"Exist witness stack. OP_TRUE is unused.",
                   (allocator *)this_01);
        core::CfdException::CfdException
                  (this_01,(CfdError)((ulong)uVar4 >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        local_62 = 0;
        __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::AbstractTxIn::GetUnlockingScript(&local_a0,local_18);
      in_stack_ffffffffffffff17 = core::Script::IsEmpty(&local_a0);
      in_stack_ffffffffffffff16 = in_stack_ffffffffffffff17 ^ 0xff;
      core::Script::~Script(in_stack_ffffffffffffff00);
      if ((in_stack_ffffffffffffff16 & 1) != 0) {
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"Exist scriptsig. OP_TRUE is unused.",&local_c1);
        core::CfdException::CfdException
                  (in_stack_ffffffffffffff20,error_code,
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_1 = 1;
      goto LAB_00665407;
    }
  }
  local_1 = 0;
LAB_00665407:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  return (bool)(local_1 & 1);
}

Assistant:

bool TransactionContextUtil::IsOpTrueLockingScript(
    const UtxoData& utxo, const AbstractTxIn* txin) {
  std::vector<ScriptElement> locking_script_items =
      utxo.locking_script.GetElementList();
  if (locking_script_items.size() == 1) {
    if (locking_script_items[0].GetOpCode() == ScriptOperator::OP_TRUE) {
      if (txin->GetScriptWitnessStackNum() != 0) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist witness stack. OP_TRUE is unused.");
      }
      if (!txin->GetUnlockingScript().IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist scriptsig. OP_TRUE is unused.");
      }
      return true;  // OP_TRUE only.
    }
  }
  return false;
}